

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O3

string * formatFloatNumber(string *__return_storage_ptr__,string *number)

{
  bool bVar1;
  pointer pcVar2;
  long lVar3;
  size_type sVar4;
  uint uVar5;
  char *pcVar6;
  pointer pcVar7;
  char cVar8;
  string local_68;
  string local_48;
  
  pcVar7 = (number->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar7,pcVar7 + number->_M_string_length);
  bVar1 = contain(&local_48,'.');
  if (!bVar1) {
    __assert_fail("contain(number, \'.\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/egor-baranov[P]Neko/helpers.hpp"
                  ,0x12d,"string formatFloatNumber(string)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (number->_M_dataplus)._M_p;
  sVar4 = number->_M_string_length;
  pcVar2 = pcVar7 + (sVar4 - 1);
  if (pcVar7 < pcVar2 && sVar4 != 0) {
    do {
      pcVar6 = pcVar7 + 1;
      cVar8 = *pcVar7;
      *pcVar7 = *pcVar2;
      *pcVar2 = cVar8;
      pcVar2 = pcVar2 + -1;
      pcVar7 = pcVar6;
    } while (pcVar6 < pcVar2);
    pcVar7 = (number->_M_dataplus)._M_p;
    sVar4 = number->_M_string_length;
  }
  if (sVar4 == 1) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = (int)sVar4 - 1;
    cVar8 = *pcVar7;
    lVar3 = 0;
    do {
      if ((cVar8 != '0') || (cVar8 = pcVar7[lVar3 + 1], cVar8 == '.')) {
        uVar5 = (uint)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (sVar4 - 1 != lVar3);
    uVar5 = ~uVar5;
  }
  pcVar2 = pcVar7 + (sVar4 - 1);
  if (pcVar7 < pcVar2 && sVar4 != 0) {
    do {
      pcVar6 = pcVar7 + 1;
      cVar8 = *pcVar7;
      *pcVar7 = *pcVar2;
      *pcVar2 = cVar8;
      pcVar2 = pcVar2 + -1;
      pcVar7 = pcVar6;
    } while (pcVar6 < pcVar2);
    pcVar7 = (number->_M_dataplus)._M_p;
    sVar4 = number->_M_string_length;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar7,pcVar7 + sVar4);
  sliceString(__return_storage_ptr__,&local_68,0,uVar5 + (int)number->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string formatFloatNumber(string number) {
	assert(contain(number, '.'));
	int zeroPostfix = 0;
	reverse(number.begin(), number.end());
	for (int i = 0; i < number.size() - 1; ++i) {
		if (number[i] == '0' and number[i + 1] != '.') {
			++zeroPostfix;
		} else break;
	}
	reverse(number.begin(), number.end());
	return sliceString(number, 0, number.size() - zeroPostfix - 1);
}